

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_set_iv(mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  size_t __n;
  
  iVar2 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (pmVar1 = ctx->cipher_info, iVar2 = -0x6100,
      iv != (uchar *)0x0 && pmVar1 != (mbedtls_cipher_info_t *)0x0)) &&
     (iVar2 = -0x6080, iv_len < 0x11)) {
    __n = iv_len;
    if (((pmVar1->flags & 1) == 0) && (__n = (size_t)pmVar1->iv_size, iv_len < __n)) {
      return -0x6100;
    }
    memcpy(ctx->iv,iv,__n);
    ctx->iv_size = __n;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_set_iv( mbedtls_cipher_context_t *ctx,
                   const unsigned char *iv, size_t iv_len )
{
    size_t actual_iv_size;

    if( NULL == ctx || NULL == ctx->cipher_info || NULL == iv )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    /* avoid buffer overflow in ctx->iv */
    if( iv_len > MBEDTLS_MAX_IV_LENGTH )
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );

    if( ( ctx->cipher_info->flags & MBEDTLS_CIPHER_VARIABLE_IV_LEN ) != 0 )
        actual_iv_size = iv_len;
    else
    {
        actual_iv_size = ctx->cipher_info->iv_size;

        /* avoid reading past the end of input buffer */
        if( actual_iv_size > iv_len )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    memcpy( ctx->iv, iv, actual_iv_size );
    ctx->iv_size = actual_iv_size;

    return( 0 );
}